

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BitmapIndexBuilder::get_run
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          BitmapIndexBuilder *this,TriGram val)

{
  int shift;
  uint uVar1;
  uint local_2c;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
    if (((this->raw_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[val] >> (uVar1 & 0x1f) & 1) != 0) {
      local_2c = uVar1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (__return_storage_ptr__,&local_2c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FileId> BitmapIndexBuilder::get_run(TriGram val) const {
    uint32_t run_start = file_run_size * val;
    std::vector<FileId> result;
    for (int offset = 0; offset < file_run_size; offset++) {
        for (int shift = 0; shift < 8; shift++) {
            if ((raw_data[run_start + offset] & (1 << shift)) != 0) {
                result.push_back(offset * 8 + shift);
            }
        }
    }
    return result;
}